

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApiDebug.cpp
# Opt level: O1

void renderGui(void)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  ImDrawData *draw_data;
  int v_min;
  char *eModes [2];
  ImVec2 local_20;
  ImVec2 local_18;
  char *pcStack_10;
  leb_Node lVar4;
  
  ImGui_ImplOpenGL3_NewFrame();
  ImGui_ImplGlfw_NewFrame();
  ImGui::NewFrame();
  local_18.x = 0.0;
  local_18.y = 0.0;
  local_20.x = 0.0;
  local_20.y = 0.0;
  ImGui::SetNextWindowPos(&local_18,0,&local_20);
  local_18.x = 256.0;
  local_18.y = 800.0;
  ImGui::SetNextWindowSize(&local_18,0);
  ImGui::Begin("Window",(bool *)0x0,0);
  local_18 = (ImVec2)0x1adbe4;
  pcStack_10 = "Quad";
  bVar1 = ImGui::Combo("Mode",&g_params.mode,(char **)&local_18,2,-1);
  if (bVar1) {
    loadTriangleProgram();
    bintree::reset(&g_bintree,g_params.minDepth,g_params.maxDepth);
  }
  bVar1 = ImGui::SliderInt("MinDepth",&g_params.minDepth,0,g_params.maxDepth,"%d");
  if (bVar1) {
    bintree::reset(&g_bintree,g_params.minDepth,g_params.maxDepth);
  }
  v_min = 5;
  if (5 < g_params.minDepth) {
    v_min = g_params.minDepth;
  }
  bVar1 = ImGui::SliderInt("MaxDepth",&g_params.maxDepth,v_min,0x1d,"%d");
  if (bVar1) {
    bintree::reset(&g_bintree,g_params.minDepth,g_params.maxDepth);
  }
  ImGui::SliderFloat("TargetX",&g_params.target.x,0.0,1.0,"%.3f",1.0);
  ImGui::SliderFloat("TargetY",&g_params.target.y,0.0,1.0,"%.3f",1.0);
  ImGui::SliderFloat("Radius",&g_params.radius,0.0,1.0,"%.3f",1.0);
  local_20.x = 0.0;
  local_20.y = 0.0;
  bVar1 = ImGui::Button("Reset Tree",&local_20);
  if (bVar1) {
    bintree::build(&g_bintree,&g_params.target,g_params.maxDepth);
    loadNodeBuffer();
  }
  ImGui::Checkbox("Freeze",&g_params.flags.freeze);
  ImGui::Text("Mem Usage: %u Bytes",
              (ulong)((uint)(1 << ((char)g_params.maxDepth + 2U & 0x1f)) >> 3 & 0xfffffffc));
  uVar2 = leb__HeapRead(g_bintree.m_leb,(leb_Node)0x1);
  ImGui::Text("Nodes: %u",(ulong)uVar2);
  if (g_params.mode == 0) {
    lVar4 = leb_BoundingNode(g_bintree.m_leb,g_params.target.x,g_params.target.y);
    uVar3 = lVar4.id;
  }
  else {
    lVar4 = leb_BoundingNode_Quad(g_bintree.m_leb,g_params.target.x,g_params.target.y);
    uVar3 = lVar4.id;
  }
  ImGui::Text("Bounding Node: %u",(ulong)uVar3);
  ImGui::End();
  ImGui::Render();
  draw_data = ImGui::GetDrawData();
  ImGui_ImplOpenGL3_RenderDrawData(draw_data);
  return;
}

Assistant:

void renderGui()
{
    ImGui_ImplOpenGL3_NewFrame();
    ImGui_ImplGlfw_NewFrame();
    ImGui::NewFrame();
    ImGui::SetNextWindowPos(ImVec2(0, 0)/*, ImGuiSetCond_FirstUseEver*/);
    ImGui::SetNextWindowSize(ImVec2(256, VIEWPORT_WIDTH)/*, ImGuiSetCond_FirstUseEver*/);
    ImGui::Begin("Window");
    {
        const char* eModes[] = {
            "Triangle",
            "Quad"
        };
        if (ImGui::Combo("Mode", &g_params.mode, &eModes[0], 2)) {
            loadTriangleProgram();
            g_bintree.reset(g_params.minDepth, g_params.maxDepth);
        }
        if (ImGui::SliderInt("MinDepth", &g_params.minDepth, 0, g_params.maxDepth)) {
            g_bintree.reset(g_params.minDepth, g_params.maxDepth);
        }
        if (ImGui::SliderInt("MaxDepth", &g_params.maxDepth, std::max(5, g_params.minDepth), 29)) {
            g_bintree.reset(g_params.minDepth, g_params.maxDepth);
        }
        ImGui::SliderFloat("TargetX", &g_params.target.x, 0, 1);
        ImGui::SliderFloat("TargetY", &g_params.target.y, 0, 1);
        ImGui::SliderFloat("Radius", &g_params.radius, 0, 1);
        if (ImGui::Button("Reset Tree")) {
            g_bintree.build(g_params.target, g_params.maxDepth);
            loadNodeBuffer();
        }
        ImGui::Checkbox("Freeze", &g_params.flags.freeze);
        ImGui::Text("Mem Usage: %u Bytes", leb__HeapByteSize(g_params.maxDepth));
        ImGui::Text("Nodes: %u", g_bintree.size());
        ImGui::Text("Bounding Node: %u",
                    g_params.mode == MODE_TRIANGLE ?
                                    leb_BoundingNode(g_bintree.m_leb,
                                                     g_params.target.x,
                                                     g_params.target.y).id
                                  : leb_BoundingNode_Quad(g_bintree.m_leb,
                                                          g_params.target.x,
                                                          g_params.target.y).id);
    }
    ImGui::End();

    ImGui::Render();
    ImGui_ImplOpenGL3_RenderDrawData(ImGui::GetDrawData());
}